

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type_conflict
time_plain<boost::random::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>>
          (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *r)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  result_type_conflict rVar4;
  long lVar5;
  string res;
  string local_40;
  double local_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  uVar2 = r->_x;
  rVar4 = 0;
  lVar5 = 0x1000000;
  do {
    uVar3 = (uint)(((ulong)uVar2 * 0xbc8f) / 0x7fffffff);
    uVar2 = (int)((ulong)uVar2 * 0xbc8f) + (uVar3 << 0x1f | uVar3);
    rVar4 = rVar4 + uVar2;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  r->_x = uVar2;
  lVar5 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar5 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar4;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}